

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::ShaderSourceSplitCase::generateFullSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceSplitCase *this)

{
  char *pcVar1;
  ostringstream out;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"precision mediump float;\n",0x19);
  if (this->m_shaderType == SHADERTYPE_FRAGMENT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"layout(location = 0) out mediump vec4 o_fragColor;\n",0x33);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tfloat variable = 1.0f;\n",0x18);
  if (this->m_shaderType == SHADERTYPE_VERTEX) {
    pcVar1 = "\tgl_Position = vec4(variable);\n";
  }
  else {
    if (this->m_shaderType != SHADERTYPE_FRAGMENT) goto LAB_0107de32;
    pcVar1 = "\to_fragColor = vec4(variable);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,0x1f);
LAB_0107de32:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string generateFullSource (void)
	{
		std::ostringstream out;

		out << "#version 300 es\n";
		out << "precision mediump float;\n";

		if (m_shaderType == glu::SHADERTYPE_FRAGMENT)
			out << "layout(location = 0) out mediump vec4 o_fragColor;\n";

		out << "void main()\n";
		out << "{\n";
		out << "	float variable = 1.0f;\n";

		if		(m_shaderType == glu::SHADERTYPE_VERTEX)	out << "	gl_Position = vec4(variable);\n";
		else if	(m_shaderType == glu::SHADERTYPE_FRAGMENT)	out << "	o_fragColor = vec4(variable);\n";

		out << "}\n";

		return out.str();
	}